

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void print_bb_insn(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn,int with_notes_p)

{
  byte bVar1;
  MIR_reg_t MVar2;
  uint uVar3;
  MIR_context_t ctx;
  long *plVar4;
  dead_var_t_conflict pdVar5;
  bitmap_t pVVar6;
  func_cfg_t pfVar7;
  bb_t pbVar8;
  bb_t_conflict pbVar9;
  MIR_op_t op_00;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  int extraout_EDX;
  bb_t extraout_RDX;
  FILE *__stream;
  bb_t_conflict pbVar14;
  char *pcVar15;
  bb_insn_t_conflict pbVar16;
  gen_ctx *ctx_00;
  ulong uVar17;
  uint *puVar18;
  bb_insn_t_conflict pbVar19;
  long *plVar20;
  long lVar21;
  MIR_op_t op;
  undefined8 local_68;
  undefined7 uStack_5f;
  undefined4 uStack_54;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  ctx = gen_ctx->ctx;
  print_insn(gen_ctx,bb_insn->insn,0);
  pcVar15 = " # indexes: ";
  __stream = (FILE *)0xc;
  fwrite(" # indexes: ",0xc,1,(FILE *)gen_ctx->debug_file);
  if (*(int *)&bb_insn->insn->field_0x1c != 0) {
    uVar11 = 0;
    do {
      if (uVar11 != 0) {
        fputc(0x2c,(FILE *)gen_ctx->debug_file);
      }
      plVar4 = (long *)bb_insn->insn->ops[uVar11].data;
      if (plVar4 == (long *)0x0) {
        __stream = (FILE *)gen_ctx->debug_file;
        pcVar15 = (char *)0x5f;
        fputc(0x5f,__stream);
      }
      else {
        plVar20 = plVar4;
        if ((bb_insn_t_conflict)plVar4[1] == bb_insn) {
          do {
            pcVar15 = ", ";
            if (plVar20 == plVar4) {
              pcVar15 = "(";
            }
            fprintf((FILE *)gen_ctx->debug_file,"%s%d",pcVar15,(ulong)*(uint *)(*plVar20 + 0xc));
            plVar20 = (long *)plVar20[4];
          } while (plVar20 != (long *)0x0);
          __stream = (FILE *)gen_ctx->debug_file;
          pcVar15 = (char *)0x29;
          fputc(0x29,__stream);
        }
        else {
          pcVar15 = (char *)gen_ctx->debug_file;
          __stream = (FILE *)0x1bee64;
          fprintf((FILE *)pcVar15,"%d",(ulong)((bb_insn_t_conflict)plVar4[1])->index);
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < *(uint *)&bb_insn->insn->field_0x1c);
  }
  if (with_notes_p != 0) {
    for (pdVar5 = (bb_insn->insn_dead_vars).head; pdVar5 != (dead_var_t_conflict)0x0;
        pdVar5 = (pdVar5->dead_var_link).next) {
      MVar2 = pdVar5->var;
      pcVar15 = " # dead: ";
      if (pdVar5 != (bb_insn->insn_dead_vars).head) {
        pcVar15 = " ";
      }
      fprintf((FILE *)gen_ctx->debug_file,pcVar15);
      __stream = (FILE *)gen_ctx->debug_file;
      op_00._9_7_ = uStack_5f;
      op_00._8_1_ = 2;
      op_00.u.mem.alias = uStack_54;
      op_00.u.reg = MVar2;
      op_00.data = (void *)local_68;
      op_00.u.str.s = (char *)uStack_50;
      op_00.u._16_8_ = uStack_48;
      op_00.u.mem.disp = uStack_40;
      pcVar15 = (char *)ctx;
      MIR_output_op(ctx,(FILE *)__stream,op_00,(gen_ctx->curr_func_item->u).func);
    }
    if (0xfffffffc < *(int *)&bb_insn->insn->field_0x18 - 0xaaU) {
      pVVar6 = bb_insn->call_hard_reg_args;
      if (pVVar6 != (bitmap_t)0x0) {
        pcVar13 = " # call used: hr%ld";
        pbVar19 = (bb_insn_t_conflict)0x0;
        do {
          uVar12 = (ulong)pbVar19 >> 6;
          uVar11 = pVVar6->els_num;
          bVar10 = true;
          pbVar16 = pbVar19;
          if (uVar12 < uVar11) {
            pbVar16 = (bb_insn_t_conflict)(uVar11 << 6);
LAB_0016033d:
            if ((pVVar6->varr[uVar12] == 0) ||
               (uVar17 = pVVar6->varr[uVar12] >> ((ulong)pbVar19 & 0x3f), uVar17 == 0))
            goto LAB_00160350;
            uVar11 = uVar17 & 1;
            bb_insn = pbVar19;
            while (uVar11 == 0) {
              bb_insn = (bb_insn_t_conflict)((long)&bb_insn->insn + 1);
              uVar11 = uVar17 & 2;
              uVar17 = uVar17 >> 1;
            }
            pbVar16 = (bb_insn_t_conflict)((long)&bb_insn->insn + 1);
            bVar10 = false;
          }
LAB_00160384:
          if (bVar10) goto LAB_001602e4;
          pcVar15 = (char *)gen_ctx->debug_file;
          fprintf((FILE *)pcVar15,pcVar13,bb_insn);
          __stream = (FILE *)0x1b4346;
          pcVar13 = " hr%ld";
          pbVar19 = pbVar16;
        } while (pVVar6 != (bitmap_t)0x0);
      }
      print_bb_insn_cold_1();
      ctx_00 = ((MIR_context_t)pcVar15)->gen_ctx;
      MIR_output_insn((MIR_context_t)ctx_00,
                      *(FILE **)&((MIR_context_t)pcVar15)->func_redef_permission_p,
                      (MIR_insn_t_conflict)__stream,
                      *(MIR_func_t *)(((MIR_context_t)pcVar15)->error_func + 0x40),0);
      if (*(int *)((long)&__stream->_IO_read_base + 4) != 0) {
        puVar18 = (uint *)((long)&__stream->_IO_buf_base + 4);
        uVar11 = 0;
        do {
          if (*puVar18 != 0 && (char)puVar18[-5] == '\v') {
            pbVar14 = (bb_t_conflict)(((MIR_context_t)((long)pcVar15 + 0x118))->all_modules).tail;
            if (((pbVar14 == (bb_t_conflict)0x0) || (pbVar14->rpost == 0)) ||
               (uVar12 = (ulong)*puVar18, pbVar14->index <= uVar12)) {
              print_insn_cold_1();
              if ((pbVar14 == (bb_t_conflict)0x0) ||
                 (pfVar7 = ctx_00->curr_cfg, (pfVar7->bbs).head == (bb_t_conflict)0x0)) {
                insert_new_bb_after_cold_3();
LAB_00160514:
                insert_new_bb_after_cold_1();
              }
              else {
                pbVar8 = (pbVar14->bb_link).next;
                pbVar9 = (pfVar7->bbs).tail;
                if (pbVar8 != (bb_t)0x0) {
                  if (pbVar9 != (bb_t_conflict)0x0) {
                    (pbVar8->bb_link).prev = extraout_RDX;
                    (extraout_RDX->bb_link).next = pbVar8;
                    (pbVar14->bb_link).next = extraout_RDX;
                    (extraout_RDX->bb_link).prev = pbVar14;
                    goto LAB_001604fb;
                  }
                  goto LAB_00160514;
                }
                if (pbVar9 == pbVar14) {
                  (pbVar14->bb_link).next = extraout_RDX;
                  (extraout_RDX->bb_link).prev = pbVar14;
                  (extraout_RDX->bb_link).next = (bb_t)0x0;
                  (pfVar7->bbs).tail = extraout_RDX;
LAB_001604fb:
                  uVar3 = ctx_00->curr_bb_index;
                  ctx_00->curr_bb_index = uVar3 + 1;
                  extraout_RDX->index = (ulong)uVar3;
                  return;
                }
              }
              insert_new_bb_after_cold_2();
              if (ctx_00->to_free == (VARR_void_ptr_t *)0x0) goto LAB_00160584;
              if (*(long *)&ctx_00->addr_insn_p != 0) {
                if (ctx_00->optimize_level != 0) {
                  lVar21 = *(long *)(*(long *)&ctx_00->addr_insn_p + 0x10) + 8;
                  uVar11 = 0;
                  do {
                    if (*(int *)(lVar21 + -8) != 0) {
                      (*(code *)ctx_00->to_free)();
                    }
                    uVar11 = uVar11 + 1;
                    lVar21 = lVar21 + 0x20;
                  } while (uVar11 < ctx_00->optimize_level);
                }
LAB_00160584:
                ctx_00->optimize_level = 0;
                ctx_00->ctx = (MIR_context_t)0x0;
                pVVar6 = ctx_00->tied_regs;
                if (pVVar6 != (bitmap_t)0x0) {
                  if ((int)pVVar6->els_num == 0) {
                    return;
                  }
                  memset(pVVar6->varr,0xff,(pVVar6->els_num & 0xffffffff) << 2);
                  return;
                }
                HTAB_def_tab_el_t_clear_cold_2();
              }
              HTAB_def_tab_el_t_clear_cold_1();
              return;
            }
            bVar1 = *(byte *)(pbVar14->rpost + uVar12 * 0x20);
            pcVar13 = "u";
            if ((bVar1 & 3) != 0) {
              pcVar13 = "au";
            }
            ctx_00 = *(gen_ctx **)&((MIR_context_t)pcVar15)->func_redef_permission_p;
            if (bVar1 == 0) {
              pcVar13 = "";
            }
            fprintf((FILE *)ctx_00," # m%lu%s",uVar12,pcVar13);
          }
          uVar11 = uVar11 + 1;
          puVar18 = puVar18 + 0xc;
        } while (uVar11 < *(uint *)((long)&__stream->_IO_read_base + 4));
      }
      if (extraout_EDX == 0) {
        return;
      }
      fputc(10,*(FILE **)&((MIR_context_t)pcVar15)->func_redef_permission_p);
      return;
    }
  }
LAB_001602e4:
  fputc(10,(FILE *)gen_ctx->debug_file);
  return;
LAB_00160350:
  uVar12 = uVar12 + 1;
  pbVar19 = (bb_insn_t_conflict)(uVar12 * 0x40);
  if (uVar11 == uVar12) goto LAB_00160384;
  goto LAB_0016033d;
}

Assistant:

static void print_bb_insn (gen_ctx_t gen_ctx, bb_insn_t bb_insn, int with_notes_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_op_t op;
  int first_p;
  size_t nel;
  bitmap_iterator_t bi;

  print_insn (gen_ctx, bb_insn->insn, FALSE);
  fprintf (debug_file, " # indexes: ");
  for (size_t i = 0; i < bb_insn->insn->nops; i++) {
    if (i != 0) fprintf (debug_file, ",");
    print_op_data (gen_ctx, bb_insn->insn->ops[i].data, bb_insn);
  }
  if (with_notes_p) {
    for (dead_var_t dv = DLIST_HEAD (dead_var_t, bb_insn->insn_dead_vars); dv != NULL;
         dv = DLIST_NEXT (dead_var_t, dv)) {
      op.mode = MIR_OP_VAR;
      op.u.var = dv->var;
      fprintf (debug_file,
               dv == DLIST_HEAD (dead_var_t, bb_insn->insn_dead_vars) ? " # dead: " : " ");
      MIR_output_op (ctx, debug_file, op, curr_func_item->u.func);
    }
    if (MIR_call_code_p (bb_insn->insn->code)) {
      first_p = TRUE;
      FOREACH_BITMAP_BIT (bi, bb_insn->call_hard_reg_args, nel) {
        fprintf (debug_file, first_p ? " # call used: hr%ld" : " hr%ld", (unsigned long) nel);
        first_p = FALSE;
      }
    }
  }
  fprintf (debug_file, "\n");
}